

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

void duckdb::HandleCastError::AssignError
               (string *error_message,string *error_message_ptr,optional_idx error_location)

{
  ConversionException *this;
  
  if (error_message_ptr == (string *)0x0) {
    this = (ConversionException *)__cxa_allocate_exception(0x10);
    ConversionException::ConversionException(this,error_location,error_message);
    __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (error_message_ptr->_M_string_length != 0) {
    return;
  }
  ::std::__cxx11::string::_M_assign((string *)error_message_ptr);
  return;
}

Assistant:

static void AssignError(const string &error_message, string *error_message_ptr,
	                        optional_idx error_location = optional_idx()) {
		if (!error_message_ptr) {
			throw ConversionException(error_location, error_message);
		}
		if (error_message_ptr->empty()) {
			*error_message_ptr = error_message;
		}
	}